

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O2

KktInfo * presolve::dev_kkt_check::initInfo(void)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  KktInfo *in_RDI;
  key_type local_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined8 local_18;
  
  p_Var1 = &(in_RDI->rules)._M_t._M_impl.super__Rb_tree_header;
  (in_RDI->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->rules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)((long)&(in_RDI->rules)._M_t._M_impl.super__Rb_tree_header._M_node_count + 6) = 0;
  local_28 = 0;
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 0;
  local_18 = 0;
  local_30 = kColBounds;
  pmVar2 = std::
           map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
           ::operator[](&in_RDI->rules,&local_30);
  pmVar2->type = kColBounds;
  *(ulong *)&pmVar2->field_0x4 = CONCAT44(local_28,uStack_2c);
  *(ulong *)((long)&pmVar2->max_violation + 4) = CONCAT44(uStack_20,uStack_24);
  pmVar2->sum_violation_2 = (double)CONCAT44(uStack_1c,uStack_20);
  pmVar2->checked = (undefined4)local_18;
  pmVar2->violated = local_18._4_4_;
  local_18 = 0;
  local_28 = 0;
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 0;
  local_30 = kPrimalFeasibility;
  pmVar2 = std::
           map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
           ::operator[](&in_RDI->rules,&local_30);
  pmVar2->type = kPrimalFeasibility;
  *(ulong *)&pmVar2->field_0x4 = CONCAT44(local_28,uStack_2c);
  *(ulong *)((long)&pmVar2->max_violation + 4) = CONCAT44(uStack_20,uStack_24);
  pmVar2->sum_violation_2 = (double)CONCAT44(uStack_1c,uStack_20);
  pmVar2->checked = (undefined4)local_18;
  pmVar2->violated = local_18._4_4_;
  local_18 = 0;
  local_28 = 0;
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 0;
  local_30 = kDualFeasibility;
  pmVar2 = std::
           map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
           ::operator[](&in_RDI->rules,&local_30);
  pmVar2->type = kDualFeasibility;
  *(ulong *)&pmVar2->field_0x4 = CONCAT44(local_28,uStack_2c);
  *(ulong *)((long)&pmVar2->max_violation + 4) = CONCAT44(uStack_20,uStack_24);
  pmVar2->sum_violation_2 = (double)CONCAT44(uStack_1c,uStack_20);
  pmVar2->checked = (undefined4)local_18;
  pmVar2->violated = local_18._4_4_;
  local_18 = 0;
  local_28 = 0;
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 0;
  local_30 = kComplementarySlackness;
  pmVar2 = std::
           map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
           ::operator[](&in_RDI->rules,&local_30);
  pmVar2->type = kComplementarySlackness;
  *(ulong *)&pmVar2->field_0x4 = CONCAT44(local_28,uStack_2c);
  *(ulong *)((long)&pmVar2->max_violation + 4) = CONCAT44(uStack_20,uStack_24);
  pmVar2->sum_violation_2 = (double)CONCAT44(uStack_1c,uStack_20);
  pmVar2->checked = (undefined4)local_18;
  pmVar2->violated = local_18._4_4_;
  local_18 = 0;
  local_28 = 0;
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 0;
  local_30 = kStationarityOfLagrangian;
  pmVar2 = std::
           map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
           ::operator[](&in_RDI->rules,&local_30);
  pmVar2->type = kStationarityOfLagrangian;
  *(ulong *)&pmVar2->field_0x4 = CONCAT44(local_28,uStack_2c);
  *(ulong *)((long)&pmVar2->max_violation + 4) = CONCAT44(uStack_20,uStack_24);
  pmVar2->sum_violation_2 = (double)CONCAT44(uStack_1c,uStack_20);
  pmVar2->checked = (undefined4)local_18;
  pmVar2->violated = local_18._4_4_;
  local_18 = 0;
  local_28 = 0;
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 0;
  local_30 = kBasicFeasibleSolution;
  pmVar2 = std::
           map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
           ::operator[](&in_RDI->rules,&local_30);
  pmVar2->type = kBasicFeasibleSolution;
  *(ulong *)&pmVar2->field_0x4 = CONCAT44(local_28,uStack_2c);
  *(ulong *)((long)&pmVar2->max_violation + 4) = CONCAT44(uStack_20,uStack_24);
  pmVar2->sum_violation_2 = (double)CONCAT44(uStack_1c,uStack_20);
  pmVar2->checked = (undefined4)local_18;
  pmVar2->violated = local_18._4_4_;
  return in_RDI;
}

Assistant:

KktInfo initInfo() {
  KktInfo info;
  info.rules[KktCondition::kColBounds] =
      KktConditionDetails(KktCondition::kColBounds);
  info.rules[KktCondition::kPrimalFeasibility] =
      KktConditionDetails(KktCondition::kPrimalFeasibility);
  info.rules[KktCondition::kDualFeasibility] =
      KktConditionDetails(KktCondition::kDualFeasibility);
  info.rules[KktCondition::kComplementarySlackness] =
      KktConditionDetails(KktCondition::kComplementarySlackness);
  info.rules[KktCondition::kStationarityOfLagrangian] =
      KktConditionDetails(KktCondition::kStationarityOfLagrangian);
  info.rules[KktCondition::kBasicFeasibleSolution] =
      KktConditionDetails(KktCondition::kBasicFeasibleSolution);
  return info;
}